

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void xmlHashScanFull(xmlHashTablePtr hash,xmlHashScannerFull scan,void *data)

{
  xmlHashEntry *pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  ulong uVar5;
  uint uVar6;
  xmlHashEntry *pxVar7;
  void *pvVar8;
  xmlChar *pxVar9;
  xmlHashEntry *pxVar10;
  bool bVar11;
  
  if ((hash != (xmlHashTablePtr)0x0) &&
     (uVar5 = (ulong)hash->size, scan != (xmlHashScannerFull)0x0 && uVar5 != 0)) {
    pxVar1 = hash->table;
    pxVar7 = pxVar1 + uVar5;
    pxVar10 = pxVar1;
    while (pxVar10->hashValue != 0) {
      pxVar10 = pxVar10 + 1;
      if (pxVar7 <= pxVar10) {
        pxVar10 = pxVar1;
      }
    }
    for (uVar6 = 0; uVar6 < (uint)uVar5; uVar6 = uVar6 + 1) {
      if ((pxVar10->hashValue != 0) && (pvVar8 = pxVar10->payload, pvVar8 != (void *)0x0)) {
        pxVar9 = pxVar10->key;
        do {
          pxVar2 = pxVar10->key2;
          pxVar3 = pxVar10->key3;
          (*scan)(pvVar8,data,pxVar9,pxVar2,pxVar3);
          if ((pxVar10->hashValue == 0) || (pvVar8 = pxVar10->payload, pvVar8 == (void *)0x0))
          break;
          pxVar4 = pxVar10->key;
          bVar11 = pxVar4 != pxVar9;
          pxVar9 = pxVar4;
        } while ((bVar11) || ((pxVar10->key2 != pxVar2 || (pxVar10->key3 != pxVar3))));
      }
      pxVar10 = pxVar10 + 1;
      if (pxVar7 <= pxVar10) {
        pxVar10 = hash->table;
      }
      uVar5 = (ulong)hash->size;
    }
  }
  return;
}

Assistant:

void
xmlHashScanFull(xmlHashTablePtr hash, xmlHashScannerFull scan, void *data) {
    const xmlHashEntry *entry, *end;
    xmlHashEntry old;
    unsigned i;

    if ((hash == NULL) || (hash->size == 0) || (scan == NULL))
        return;

    /*
     * We must handle the case that a scanned entry is removed when executing
     * the callback (xmlCleanSpecialAttr and possibly other places).
     *
     * Find the start of a probe sequence to avoid scanning entries twice if
     * a deletion happens.
     */
    entry = hash->table;
    end = &hash->table[hash->size];
    while (entry->hashValue != 0) {
        if (++entry >= end)
            entry = hash->table;
    }

    for (i = 0; i < hash->size; i++) {
        if ((entry->hashValue != 0) && (entry->payload != NULL)) {
            /*
             * Make sure to rescan after a possible deletion.
             */
            do {
                old = *entry;
                scan(entry->payload, data, entry->key, entry->key2, entry->key3);
            } while ((entry->hashValue != 0) &&
                     (entry->payload != NULL) &&
                     ((entry->key != old.key) ||
                      (entry->key2 != old.key2) ||
                      (entry->key3 != old.key3)));
        }
        if (++entry >= end)
            entry = hash->table;
    }
}